

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cc
# Opt level: O2

char * __thiscall pstack::Context::dirname(Context *this,char *__path)

{
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  allocator<char> local_19;
  
  __n = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                  (in_RDX,'/',0xffffffffffffffff);
  if (__n == 0xffffffffffffffff) {
    std::__cxx11::string::string<std::allocator<char>>((string *)this,".",&local_19);
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,in_RDX,0,
               __n);
  }
  return (char *)this;
}

Assistant:

std::string
Context::dirname(const std::string &in)
{
    auto it = in.rfind('/');
    if (it == std::string::npos)
        return ".";
    return in.substr(0, it);
}